

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O3

void __thiscall ProcessesView::mousePressEvent(ProcessesView *this,QMouseEvent *event)

{
  char *pcVar1;
  undefined8 uVar2;
  QArrayData *pQVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  long *plVar7;
  long *plVar8;
  void **ppvVar9;
  undefined4 *puVar10;
  QString *pQVar11;
  storage_type *psVar12;
  long lVar13;
  double dVar14;
  double in_XMM1_Qa;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QArrayData *local_198;
  char16_t *pcStack_190;
  qsizetype qStack_188;
  QString t_1;
  QString t;
  QString local_148;
  QString pid;
  QPair<const_char_*,_const_char_*> signalsList [8];
  QMenu contextMenu;
  QObject local_58 [8];
  QString name;
  QObject local_38 [8];
  
  QTreeView::mousePressEvent((QMouseEvent *)this);
  dVar14 = (double)QEventPoint::position();
  _contextMenu = (int)((double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14);
  register0x00000004 =
       (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa);
  (**(code **)(*(long *)this + 0x1f0))(signalsList,this);
  pcVar1 = signalsList[0].first;
  if (((int)signalsList[0].first != -1) && (*(int *)(event + 0x40) == 2)) {
    plVar7 = (long *)QAbstractItemView::model();
    plVar8 = (long *)QAbstractItemView::model();
    local_198 = (QArrayData *)0xffffffffffffffff;
    pcStack_190 = (char16_t *)0x0;
    qStack_188 = 0;
    (**(code **)(*plVar8 + 0x60))(&contextMenu,plVar8,(ulong)pcVar1 & 0xffffffff,0);
    (**(code **)(*plVar7 + 0x90))(signalsList,plVar7,&contextMenu,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)signalsList);
    plVar7 = (long *)QAbstractItemView::model();
    plVar8 = (long *)QAbstractItemView::model();
    local_198 = (QArrayData *)0xffffffffffffffff;
    pcStack_190 = (char16_t *)0x0;
    qStack_188 = 0;
    (**(code **)(*plVar8 + 0x60))(&contextMenu,plVar8,(ulong)pcVar1 & 0xffffffff,3);
    (**(code **)(*plVar7 + 0x90))(signalsList,plVar7,&contextMenu,0);
    QVariant::toString();
    QVariant::~QVariant((QVariant *)signalsList);
    QMetaObject::tr((char *)signalsList,(char *)&staticMetaObject,0x124326);
    QMenu::QMenu(&contextMenu,(QString *)signalsList,(QWidget *)this);
    if (signalsList[0].first != (char *)0x0) {
      LOCK();
      *(int *)signalsList[0].first = *(int *)signalsList[0].first + -1;
      UNLOCK();
      if (*(int *)signalsList[0].first == 0) {
        QArrayData::deallocate((QArrayData *)signalsList[0].first,2,8);
      }
    }
    QVar15.m_data = (storage_type *)0xa;
    QVar15.m_size = (qsizetype)&t;
    QString::fromUtf8(QVar15);
    QString::append((QString *)&t);
    local_148.d.d = t.d.d;
    local_148.d.ptr = t.d.ptr;
    local_148.d.size = t.d.size;
    if (t.d.d != (Data *)0x0) {
      LOCK();
      ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar16.m_data = (storage_type *)0x6;
    QVar16.m_size = (qsizetype)signalsList;
    QString::fromUtf8(QVar16);
    QString::append((QString *)&local_148);
    if (signalsList[0].first != (char *)0x0) {
      LOCK();
      *(int *)signalsList[0].first = *(int *)signalsList[0].first + -1;
      UNLOCK();
      if (*(int *)signalsList[0].first == 0) {
        QArrayData::deallocate((QArrayData *)signalsList[0].first,2,8);
      }
    }
    t_1.d.d = local_148.d.d;
    t_1.d.ptr = local_148.d.ptr;
    t_1.d.size = local_148.d.size;
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)&t_1);
    local_198 = &(t_1.d.d)->super_QArrayData;
    pcStack_190 = t_1.d.ptr;
    qStack_188 = t_1.d.size;
    if (t_1.d.d != (Data *)0x0) {
      LOCK();
      ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar17.m_data = (storage_type *)0x1;
    QVar17.m_size = (qsizetype)signalsList;
    QString::fromUtf8(QVar17);
    QString::append((QString *)&local_198);
    if (signalsList[0].first != (char *)0x0) {
      LOCK();
      *(int *)signalsList[0].first = *(int *)signalsList[0].first + -1;
      UNLOCK();
      if (*(int *)signalsList[0].first == 0) {
        QArrayData::deallocate((QArrayData *)signalsList[0].first,2,8);
      }
    }
    ppvVar9 = (void **)QMenu::addAction((QString *)&contextMenu);
    if (local_198 != (QArrayData *)0x0) {
      LOCK();
      (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_198,2,8);
      }
    }
    if (t_1.d.d != (Data *)0x0) {
      LOCK();
      ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(t_1.d.d)->super_QArrayData,2,8);
      }
    }
    if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
      }
    }
    if (t.d.d != (Data *)0x0) {
      LOCK();
      ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(t.d.d)->super_QArrayData,2,8);
      }
    }
    qVar6 = pid.d.size;
    pcVar5 = pid.d.ptr;
    pDVar4 = pid.d.d;
    if (pid.d.d != (Data *)0x0) {
      LOCK();
      ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    signalsList[0].first = (char *)QAction::triggered;
    signalsList[0].second = (char *)0x0;
    puVar10 = (undefined4 *)operator_new(0x28);
    *puVar10 = 1;
    *(code **)(puVar10 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/congard[P]nvidia-system-monitor-qt/src/processes/ProcessesView.cpp:70:44),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(Data **)(puVar10 + 4) = pDVar4;
    *(char16_t **)(puVar10 + 6) = pcVar5;
    *(qsizetype *)(puVar10 + 8) = qVar6;
    QObject::connectImpl
              (local_58,ppvVar9,(QObject *)signalsList,ppvVar9,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar10,(int *)0x1,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    QMenu::addSeparator();
    signalsList[0].first = "Suspend";
    signalsList[0].second = "STOP";
    signalsList[1].first = "Continue";
    signalsList[1].second = "CONT";
    signalsList[2].first = "Hangup";
    signalsList[2].second = "HUP";
    signalsList[3].first = "Interrupt";
    signalsList[3].second = "INT";
    signalsList[4].first = "Terminate";
    signalsList[4].second = "TERM";
    signalsList[5].first = "Kill";
    signalsList[5].second = "KILL";
    signalsList[6].first = "User 1";
    signalsList[6].second = "USR1";
    signalsList[7].first = "User 2";
    signalsList[7].second = "USR2";
    QVar18.m_data = (storage_type *)0xb;
    QVar18.m_size = (qsizetype)&local_198;
    QString::fromUtf8(QVar18);
    t_1.d.d = (Data *)local_198;
    t_1.d.ptr = pcStack_190;
    t_1.d.size = qStack_188;
    pQVar11 = (QString *)QMenu::addMenu((QString *)&contextMenu);
    if (t_1.d.d != (Data *)0x0) {
      LOCK();
      ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(t_1.d.d)->super_QArrayData,2,8);
      }
    }
    lVar13 = 8;
    do {
      pcVar1 = *(char **)((long)signalsList + lVar13 + -8);
      if (pcVar1 == (char *)0x0) {
        psVar12 = (storage_type *)0x0;
      }
      else {
        psVar12 = (storage_type *)strlen(pcVar1);
      }
      QVar19.m_data = psVar12;
      QVar19.m_size = (qsizetype)&local_198;
      QString::fromUtf8(QVar19);
      pQVar3 = local_198;
      t.d.d = (Data *)local_198;
      t.d.ptr = pcStack_190;
      t.d.size = qStack_188;
      if (local_198 != (QArrayData *)0x0) {
        LOCK();
        (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_198->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar20.m_data = (storage_type *)0x2;
      QVar20.m_size = (qsizetype)&local_198;
      QString::fromUtf8(QVar20);
      QString::append((QString *)&t);
      if (local_198 != (QArrayData *)0x0) {
        LOCK();
        (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_198,2,8);
        }
      }
      operator+(&local_148,&t,*(char **)((long)&signalsList[0].first + lVar13));
      t_1.d.d = local_148.d.d;
      t_1.d.ptr = local_148.d.ptr;
      t_1.d.size = local_148.d.size;
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar21.m_data = (storage_type *)0x1;
      QVar21.m_size = (qsizetype)&local_198;
      QString::fromUtf8(QVar21);
      QString::append((QString *)&t_1);
      if (local_198 != (QArrayData *)0x0) {
        LOCK();
        (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_198,2,8);
        }
      }
      ppvVar9 = (void **)QMenu::addAction(pQVar11);
      if (t_1.d.d != (Data *)0x0) {
        LOCK();
        ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((t_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(t_1.d.d)->super_QArrayData,2,8);
        }
      }
      if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,2,8);
        }
      }
      if (t.d.d != (Data *)0x0) {
        LOCK();
        ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((t.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(t.d.d)->super_QArrayData,2,8);
        }
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,8);
        }
      }
      qVar6 = pid.d.size;
      pcVar5 = pid.d.ptr;
      pDVar4 = pid.d.d;
      if (pid.d.d != (Data *)0x0) {
        LOCK();
        ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      uVar2 = *(undefined8 *)((long)&signalsList[0].first + lVar13);
      local_198 = (QArrayData *)QAction::triggered;
      pcStack_190 = (char16_t *)0x0;
      puVar10 = (undefined4 *)operator_new(0x30);
      *puVar10 = 1;
      *(code **)(puVar10 + 2) =
           QtPrivate::
           QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/congard[P]nvidia-system-monitor-qt/src/processes/ProcessesView.cpp:91:47),_0,_QtPrivate::List<>,_void>
           ::impl;
      *(Data **)(puVar10 + 4) = pDVar4;
      *(char16_t **)(puVar10 + 6) = pcVar5;
      *(qsizetype *)(puVar10 + 8) = qVar6;
      *(undefined8 *)(puVar10 + 10) = uVar2;
      QObject::connectImpl
                (local_38,ppvVar9,(QObject *)&local_198,ppvVar9,(QSlotObjectBase *)0x0,
                 (ConnectionType)puVar10,(int *)0x1,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_38);
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x88);
    dVar14 = (double)QEventPoint::position();
    t_1.d.d = (Data *)CONCAT44((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 |
                                             0x3fe0000000000000) + in_XMM1_Qa),
                               (int)((double)((ulong)dVar14 & 0x8000000000000000 |
                                             0x3fe0000000000000) + dVar14));
    local_198 = (QArrayData *)QWidget::mapToGlobal((QPoint *)this);
    QMenu::exec((QPoint *)&contextMenu,(QAction *)&local_198);
    QMenu::~QMenu(&contextMenu);
    if (pid.d.d != (Data *)0x0) {
      LOCK();
      ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pid.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(pid.d.d)->super_QArrayData,2,8);
      }
    }
    if (name.d.d != (Data *)0x0) {
      LOCK();
      ((name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(name.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return;
}

Assistant:

void ProcessesView::mousePressEvent(QMouseEvent *event) {
    QTreeView::mousePressEvent(event);
    int row = indexAt(event->pos()).row();

    if (event->button() == Qt::RightButton && row != -1) {
        QString name = model()->data(model()->index(row, NVSMColumns::Name)).toString();
        QString pid = model()->data(model()->index(row, NVSMColumns::PID)).toString();

        QMenu contextMenu(tr("Context menu"), this);

        QAction *kill = contextMenu.addAction("Terminate " + name + " (pid " + pid + ")");
        connect(kill, &QAction::triggered, [pid]() {
            Utils::exec_cmd("kill " + pid);
        });

        contextMenu.addSeparator();

        QPair<const char*, const char*> signalsList[] = {
            {"Suspend", "STOP"},
            {"Continue", "CONT"},
            {"Hangup", "HUP"},
            {"Interrupt", "INT"},
            {"Terminate", "TERM"},
            {"Kill", "KILL"},
            {"User 1", "USR1"},
            {"User 2", "USR2"}
        };

        QMenu *signalMenu = contextMenu.addMenu("Send signal");

        for (auto &sig : signalsList) {
            QAction *act = signalMenu->addAction(QString(sig.first) + " (" + sig.second + ")");
            connect(act, &QAction::triggered, [pid, signal = sig.second]() {
                Utils::exec_cmd("kill -" + QString(signal) + " " + pid);
            });
        }

        contextMenu.exec(mapToGlobal(event->pos()));
    }
}